

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

UnicodeString *
icu_63::TimeZone::getCustomID(UnicodeString *id,UnicodeString *normalized,UErrorCode *status)

{
  ushort uVar1;
  UBool UVar2;
  ushort uVar3;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t sign;
  int32_t local_20;
  int32_t local_1c;
  int32_t local_18;
  undefined4 local_14;
  
  uVar1 = (normalized->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (normalized->fUnion).fStackFields.fLengthAndFlags = uVar3;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar2 = parseCustomID(id,&local_14,&local_18,&local_1c,&local_20);
    if (UVar2 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      formatCustomID(local_18,local_1c,local_20,local_14._3_1_ >> 7,normalized);
    }
  }
  return normalized;
}

Assistant:

UnicodeString&
TimeZone::getCustomID(const UnicodeString& id, UnicodeString& normalized, UErrorCode& status) {
    normalized.remove();
    if (U_FAILURE(status)) {
        return normalized;
    }
    int32_t sign, hour, min, sec;
    if (parseCustomID(id, sign, hour, min, sec)) {
        formatCustomID(hour, min, sec, (sign < 0), normalized);
    } else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return normalized;
}